

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O1

Grammar * __thiscall
xercesc_4_0::SGXMLScanner::loadXMLSchemaGrammar(SGXMLScanner *this,InputSource *src,bool toCache)

{
  SchemaValidator *pSVar1;
  XMLErrorReporter *pXVar2;
  XMLStringPool *pXVar3;
  XMLValidator *pXVar4;
  uint uVar5;
  int iVar6;
  DOMDocument *pDVar7;
  undefined4 extraout_var;
  XMLCh *namespaceKey;
  XMLCh *schemaURL;
  SchemaInfo *pSVar8;
  long *plVar9;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *pRVar10;
  XSModel *pXVar11;
  bool multipleImport;
  SchemaGrammar *unaff_R15;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> i;
  XSDDOMParser parser;
  TraverseSchema traverseSchema;
  RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> local_418;
  XSDDOMParser local_3e0;
  TraverseSchema local_268;
  DOMElement *schemaRoot;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  (*(this->fSchemaValidator->super_XMLValidator)._vptr_XMLValidator[6])();
  pSVar1 = this->fSchemaValidator;
  pXVar2 = (this->super_XMLScanner).fErrorReporter;
  (pSVar1->super_XMLValidator).fErrorReporter = pXVar2;
  (pSVar1->fSchemaErrorReporter).fErrorReporter = pXVar2;
  (pSVar1->fSchemaErrorReporter).fExitOnFirstFatal = (this->super_XMLScanner).fExitOnFirstFatal;
  pSVar1->fGrammarResolver = (this->super_XMLScanner).fGrammarResolver;
  if ((this->super_XMLScanner).fValidatorFromUser == true) {
    (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[6])();
  }
  XSDDOMParser::XSDDOMParser
            (&local_3e0,(XMLValidator *)0x0,(this->super_XMLScanner).fMemoryManager,
             (XMLGrammarPool *)0x0);
  AbstractDOMParser::setValidationScheme((AbstractDOMParser *)&local_3e0,Val_Never);
  AbstractDOMParser::setDoNamespaces((AbstractDOMParser *)&local_3e0,true);
  XSDDOMParser::setUserEntityHandler(&local_3e0,(this->super_XMLScanner).fEntityHandler);
  XSDDOMParser::setUserErrorReporter(&local_3e0,(this->super_XMLScanner).fErrorReporter);
  uVar5 = (*src->_vptr_InputSource[6])(src);
  (*src->_vptr_InputSource[10])(src,0);
  AbstractDOMParser::parse((AbstractDOMParser *)&local_3e0,src);
  (*src->_vptr_InputSource[10])(src,(ulong)(uVar5 & 0xff));
  if ((local_3e0.fSawFatal == true) && ((this->super_XMLScanner).fExitOnFirstFatal == true)) {
    XMLScanner::emitError(&this->super_XMLScanner,SchemaScanFatalError);
  }
  pDVar7 = AbstractDOMParser::getDocument((AbstractDOMParser *)&local_3e0);
  if (pDVar7 != (DOMDocument *)0x0) {
    iVar6 = (*(pDVar7->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xd])(pDVar7);
    schemaRoot = (DOMElement *)CONCAT44(extraout_var,iVar6);
    if (schemaRoot != (DOMElement *)0x0) {
      iVar6 = (*(schemaRoot->super_DOMNode)._vptr_DOMNode[0x29])
                        (schemaRoot,SchemaSymbols::fgATT_TARGETNAMESPACE);
      namespaceKey = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
      unaff_R15 = (SchemaGrammar *)
                  GrammarResolver::getGrammar
                            ((this->super_XMLScanner).fGrammarResolver,namespaceKey);
      iVar6 = (*src->_vptr_InputSource[5])(src);
      schemaURL = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
      if (unaff_R15 == (SchemaGrammar *)0x0) {
        pSVar8 = (SchemaInfo *)0x0;
      }
      else {
        if ((namespaceKey == (XMLCh *)0x0) || (*namespaceKey == L'\0')) {
          pRVar10 = this->fCachedSchemaInfoList;
          uVar5 = (this->super_XMLScanner).fEmptyNamespaceId;
        }
        else {
          pRVar10 = this->fCachedSchemaInfoList;
          pXVar3 = (this->super_XMLScanner).fURIStringPool;
          uVar5 = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3,namespaceKey);
        }
        pSVar8 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                           (pRVar10,schemaURL,uVar5);
      }
      if (pSVar8 == (SchemaInfo *)0x0) {
        if ((unaff_R15 == (SchemaGrammar *)0x0) ||
           (iVar6 = (*(unaff_R15->super_Grammar).super_XSerializable._vptr_XSerializable[5])
                              (unaff_R15), iVar6 != 1)) {
          multipleImport = false;
        }
        else {
          multipleImport = (this->super_XMLScanner).fHandleMultipleImports;
        }
        if (multipleImport == false) {
          unaff_R15 = (SchemaGrammar *)
                      XMemory::operator_new(0x98,(this->super_XMLScanner).fGrammarPoolMemoryManager)
          ;
          SchemaGrammar::SchemaGrammar(unaff_R15,(this->super_XMLScanner).fGrammarPoolMemoryManager)
          ;
        }
        iVar6 = (*(unaff_R15->super_Grammar).super_XSerializable._vptr_XSerializable[0x16])
                          (unaff_R15);
        plVar9 = (long *)CONCAT44(extraout_var_02,iVar6);
        (**(code **)(*plVar9 + 0x68))(plVar9,3);
        (**(code **)(*plVar9 + 0x78))(plVar9,schemaURL);
        pRVar10 = this->fCachedSchemaInfoList;
        if (!toCache) {
          pRVar10 = this->fSchemaInfoList;
        }
        TraverseSchema::TraverseSchema
                  (&local_268,schemaRoot,(this->super_XMLScanner).fURIStringPool,unaff_R15,
                   (this->super_XMLScanner).fGrammarResolver,this->fCachedSchemaInfoList,pRVar10,
                   &this->super_XMLScanner,schemaURL,(this->super_XMLScanner).fEntityHandler,
                   (this->super_XMLScanner).fErrorReporter,(this->super_XMLScanner).fMemoryManager,
                   multipleImport);
        RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::
        RefHash2KeysTableOfEnumerator
                  (&local_418,(&this->fSchemaInfoList)[toCache],false,
                   XMLPlatformUtils::fgMemoryManager);
        while ((local_418.fCurElem != (RefHash2KeysTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0 ||
               (local_418.fCurHash != (local_418.fToEnum)->fHashModulus))) {
          pSVar8 = RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                   ::nextElement(&local_418);
          pSVar8->fSchemaRootElement = (DOMElement *)0x0;
        }
        RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::
        ~RefHash2KeysTableOfEnumerator(&local_418);
        TraverseSchema::~TraverseSchema(&local_268);
      }
      if ((this->super_XMLScanner).fValidate == true) {
        pXVar4 = (this->super_XMLScanner).fValidator;
        (*pXVar4->_vptr_XMLValidator[0xb])(pXVar4,unaff_R15);
        pXVar4 = (this->super_XMLScanner).fValidator;
        (*pXVar4->_vptr_XMLValidator[4])(pXVar4,0,0);
      }
      if (toCache) {
        GrammarResolver::cacheGrammars((this->super_XMLScanner).fGrammarResolver);
      }
      if ((this->super_XMLScanner).fPSVIHandler != (PSVIHandler *)0x0) {
        pXVar11 = GrammarResolver::getXSModel((this->super_XMLScanner).fGrammarResolver);
        this->fModel = pXVar11;
      }
    }
    if (schemaRoot != (DOMElement *)0x0) goto LAB_002bbee5;
  }
  unaff_R15 = (SchemaGrammar *)0x0;
LAB_002bbee5:
  XSDDOMParser::~XSDDOMParser(&local_3e0);
  return &unaff_R15->super_Grammar;
}

Assistant:

Grammar* SGXMLScanner::loadXMLSchemaGrammar(const InputSource& src,
                                          const bool toCache)
{
   // Reset the validators
    fSchemaValidator->reset();
    fSchemaValidator->setErrorReporter(fErrorReporter);
    fSchemaValidator->setExitOnFirstFatal(fExitOnFirstFatal);
    fSchemaValidator->setGrammarResolver(fGrammarResolver);

    if (fValidatorFromUser)
        fValidator->reset();

    XSDDOMParser parser(0, fMemoryManager, 0);

    parser.setValidationScheme(XercesDOMParser::Val_Never);
    parser.setDoNamespaces(true);
    parser.setUserEntityHandler(fEntityHandler);
    parser.setUserErrorReporter(fErrorReporter);

    // Should just issue warning if the schema is not found
    bool flag = src.getIssueFatalErrorIfNotFound();
    ((InputSource&) src).setIssueFatalErrorIfNotFound(false);

    parser.parse(src);

    // Reset the InputSource
    ((InputSource&) src).setIssueFatalErrorIfNotFound(flag);

    if (parser.getSawFatal() && fExitOnFirstFatal)
        emitError(XMLErrs::SchemaScanFatalError);

    DOMDocument* document = parser.getDocument(); //Our Grammar

    if (document != 0) {

        DOMElement* root = document->getDocumentElement();// This is what we pass to TraverserSchema
        if (root != 0)
        {
            const XMLCh* nsUri = root->getAttribute(SchemaSymbols::fgATT_TARGETNAMESPACE);
            Grammar* grammar = fGrammarResolver->getGrammar(nsUri);

            // Check if this exact schema has already been seen.
            //
            const XMLCh* sysId = src.getSystemId();
            SchemaInfo* importSchemaInfo = 0;

            if (grammar)
            {
              if (nsUri && *nsUri)
                importSchemaInfo = fCachedSchemaInfoList->get(sysId, fURIStringPool->addOrFind(nsUri));
              else
                importSchemaInfo = fCachedSchemaInfoList->get(sysId, fEmptyNamespaceId);
            }

            if (!importSchemaInfo)
            {
              bool grammarFound = grammar &&
                grammar->getGrammarType() == Grammar::SchemaGrammarType &&
                getHandleMultipleImports();

              SchemaGrammar* schemaGrammar;

              if (grammarFound)
                schemaGrammar = (SchemaGrammar*) grammar;
              else
                schemaGrammar = new (fGrammarPoolMemoryManager) SchemaGrammar(fGrammarPoolMemoryManager);

              XMLSchemaDescription* gramDesc = (XMLSchemaDescription*) schemaGrammar->getGrammarDescription();
              gramDesc->setContextType(XMLSchemaDescription::CONTEXT_PREPARSE);
              gramDesc->setLocationHints(sysId);

              TraverseSchema traverseSchema
                (
                  root
                  , fURIStringPool
                  , schemaGrammar
                  , fGrammarResolver
                  , fCachedSchemaInfoList
                  , toCache ? fCachedSchemaInfoList : fSchemaInfoList
                  , this
                  , sysId
                  , fEntityHandler
                  , fErrorReporter
                  , fMemoryManager
                  , grammarFound
                );

              grammar = schemaGrammar;

              // Reset the now invalid schema roots in the collected
              // schema info entries.
              //
              {
                RefHash2KeysTableOfEnumerator<SchemaInfo> i (
                  toCache ? fCachedSchemaInfoList : fSchemaInfoList);

                while (i.hasMoreElements ())
                  i.nextElement().resetRoot ();
              }
            }

            if (fValidate) {
              //  validate the Schema scan so far
              fValidator->setGrammar(grammar);
              fValidator->preContentValidation(false);
            }

            if (toCache) {
              fGrammarResolver->cacheGrammars();
            }

            if(getPSVIHandler())
              fModel = fGrammarResolver->getXSModel();

            return grammar;
        }
    }

    return 0;
}